

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Add_Module(FT_Library library,FT_Module_Class *clazz)

{
  FT_Memory memory;
  FT_Memory memory_00;
  code *pcVar1;
  int iVar2;
  FT_Module pFVar3;
  FT_ListNode node;
  FT_Module_Class *pFVar4;
  ulong uVar5;
  uint uVar6;
  FT_Driver driver;
  FT_Error local_4c;
  FT_ListNode local_48;
  FT_Module_Class *local_40;
  int local_34;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (clazz == (FT_Module_Class *)0x0) {
    return 6;
  }
  if (0x20009 < clazz->module_requires) {
    return 4;
  }
  uVar6 = library->num_modules;
  uVar5 = 0;
  do {
    if (uVar6 == uVar5) goto LAB_00135671;
    pFVar3 = library->modules[uVar5];
    pFVar4 = pFVar3->clazz;
    iVar2 = strcmp(pFVar4->module_name,clazz->module_name);
    uVar5 = uVar5 + 1;
  } while (iVar2 != 0);
  if (clazz->module_version <= pFVar4->module_version) {
    return 5;
  }
  FT_Remove_Module(library,pFVar3);
  uVar6 = library->num_modules;
LAB_00135671:
  memory = library->memory;
  local_4c = 0;
  if (0x1f < uVar6) {
    return 0x30;
  }
  pFVar3 = (FT_Module)ft_mem_alloc(memory,clazz->module_size,&local_4c);
  if (local_4c != 0) {
    return local_4c;
  }
  pFVar3->library = library;
  pFVar3->memory = memory;
  pFVar3->clazz = clazz;
  uVar5 = clazz->module_flags;
  pFVar4 = clazz;
  if ((uVar5 & 2) != 0) {
    memory_00 = library->memory;
    node = (FT_ListNode)ft_mem_alloc(memory_00,0x18,&local_34);
    iVar2 = local_34;
    if (local_34 != 0) goto LAB_001357b8;
    pFVar4 = pFVar3->clazz;
    pFVar3[1].clazz = pFVar4;
    iVar2 = (int)pFVar4[1].module_flags;
    *(int *)&pFVar3[1].library = iVar2;
    if ((iVar2 == 0x6f75746c) &&
       (pcVar1 = *(code **)((long)pFVar4[1].module_interface + 8), pcVar1 != (code *)0x0)) {
      local_48 = node;
      local_40 = pFVar4;
      iVar2 = (*pcVar1)(memory_00,&pFVar3[4].library);
      if (iVar2 != 0) {
        if (local_48 != (FT_ListNode)0x0) {
          (*memory_00->free)(memory_00,local_48);
        }
        goto LAB_001357b8;
      }
      pFVar3[4].memory = *(FT_Memory *)((long)local_40[1].module_interface + 0x20);
      pFVar3[5].clazz = (FT_Module_Class *)local_40[1].module_size;
      node = local_48;
    }
    node->data = pFVar3;
    FT_List_Add(&library->renderers,node);
    ft_set_current_renderer(library);
    pFVar4 = pFVar3->clazz;
    uVar5 = pFVar4->module_flags;
  }
  if ((uVar5 & 4) != 0) {
    library->auto_hinter = pFVar3;
  }
  if ((uVar5 & 1) != 0) {
    pFVar3[1].clazz = pFVar4;
  }
  if ((clazz->module_init == (FT_Module_Constructor)0x0) ||
     (iVar2 = (*clazz->module_init)(pFVar3), iVar2 == 0)) {
    uVar6 = library->num_modules;
    library->num_modules = uVar6 + 1;
    library->modules[uVar6] = pFVar3;
    return 0;
  }
LAB_001357b8:
  if (((((pFVar3->clazz->module_flags & 2) != 0) &&
       (pFVar4 = pFVar3[1].clazz, pFVar4 != (FT_Module_Class *)0x0)) &&
      ((int)pFVar4[1].module_flags == 0x6f75746c)) && (pFVar3[4].library != (FT_Library)0x0)) {
    (**(code **)((long)pFVar4[1].module_interface + 0x28))();
  }
  (*memory->free)(memory,pFVar3);
  return iVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Add_Module( FT_Library              library,
                 const FT_Module_Class*  clazz )
  {
    FT_Error   error;
    FT_Memory  memory;
    FT_Module  module = NULL;
    FT_UInt    nn;


#define FREETYPE_VER_FIXED  ( ( (FT_Long)FREETYPE_MAJOR << 16 ) | \
                                FREETYPE_MINOR                  )

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !clazz )
      return FT_THROW( Invalid_Argument );

    /* check FreeType version */
    if ( clazz->module_requires > FREETYPE_VER_FIXED )
      return FT_THROW( Invalid_Version );

    /* look for a module with the same name in the library's table */
    for ( nn = 0; nn < library->num_modules; nn++ )
    {
      module = library->modules[nn];
      if ( ft_strcmp( module->clazz->module_name, clazz->module_name ) == 0 )
      {
        /* this installed module has the same name, compare their versions */
        if ( clazz->module_version <= module->clazz->module_version )
          return FT_THROW( Lower_Module_Version );

        /* remove the module from our list, then exit the loop to replace */
        /* it by our new version..                                        */
        FT_Remove_Module( library, module );
        break;
      }
    }

    memory = library->memory;
    error  = FT_Err_Ok;

    if ( library->num_modules >= FT_MAX_MODULES )
    {
      error = FT_THROW( Too_Many_Drivers );
      goto Exit;
    }

    /* allocate module object */
    if ( FT_ALLOC( module, clazz->module_size ) )
      goto Exit;

    /* base initialization */
    module->library = library;
    module->memory  = memory;
    module->clazz   = (FT_Module_Class*)clazz;

    /* check whether the module is a renderer - this must be performed */
    /* before the normal module initialization                         */
    if ( FT_MODULE_IS_RENDERER( module ) )
    {
      /* add to the renderers list */
      error = ft_add_renderer( module );
      if ( error )
        goto Fail;
    }

    /* is the module a auto-hinter? */
    if ( FT_MODULE_IS_HINTER( module ) )
      library->auto_hinter = module;

    /* if the module is a font driver */
    if ( FT_MODULE_IS_DRIVER( module ) )
    {
      FT_Driver  driver = FT_DRIVER( module );


      driver->clazz = (FT_Driver_Class)module->clazz;
    }

    if ( clazz->module_init )
    {
      error = clazz->module_init( module );
      if ( error )
        goto Fail;
    }

    /* add module to the library's table */
    library->modules[library->num_modules++] = module;

  Exit:
    return error;

  Fail:
    if ( FT_MODULE_IS_RENDERER( module ) )
    {
      FT_Renderer  renderer = FT_RENDERER( module );


      if ( renderer->clazz                                          &&
           renderer->clazz->glyph_format == FT_GLYPH_FORMAT_OUTLINE &&
           renderer->raster                                         )
        renderer->clazz->raster_class->raster_done( renderer->raster );
    }

    FT_FREE( module );
    goto Exit;
  }